

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

int __thiscall QString::remove(QString *this,char *__filename)

{
  char *pcVar1;
  Data *pDVar2;
  QArrayData *data;
  char16_t *pcVar3;
  long lVar4;
  long in_RDX;
  char *pcVar5;
  char16_t *__dest;
  size_t __n;
  long in_FS_OFFSET;
  QString local_68;
  char16_t *local_50 [4];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (char *)(this->d).size;
  pcVar5 = __filename + ((long)__filename >> 0x3f & (ulong)pcVar1);
  lVar4 = (long)pcVar1 - (long)pcVar5;
  if (0 < in_RDX && (pcVar5 <= pcVar1 && lVar4 != 0)) {
    if (lVar4 < in_RDX) {
      in_RDX = lVar4;
    }
    pDVar2 = (this->d).d;
    if ((pDVar2 == (Data *)0x0) ||
       ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
      local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      lVar4 = 0;
      QString(&local_68,(long)pcVar1 - in_RDX,Uninitialized);
      local_50[0] = (this->d).ptr;
      local_50[1] = local_50[0] + (long)pcVar5;
      local_50[2] = local_50[0] + (long)pcVar5 + in_RDX;
      local_50[3] = local_50[0] + (this->d).size;
      __dest = local_68.d.ptr;
      do {
        __n = *(long *)((long)local_50 + lVar4 + 8) - (long)*(void **)((long)local_50 + lVar4);
        if (__n != 0) {
          memmove(__dest,*(void **)((long)local_50 + lVar4),__n);
        }
        __dest = (char16_t *)((long)__dest + __n);
        lVar4 = lVar4 + 0x10;
      } while (lVar4 != 0x20);
      data = &((this->d).d)->super_QArrayData;
      (this->d).d = local_68.d.d;
      pcVar3 = (this->d).ptr;
      (this->d).ptr = local_68.d.ptr;
      local_68.d.size = (this->d).size;
      (this->d).size = (long)__dest - (long)local_68.d.ptr >> 1;
      local_68.d.d = (Data *)data;
      local_68.d.ptr = pcVar3;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,2,0x10);
        }
      }
    }
    else {
      QtPrivate::QPodArrayOps<char16_t>::erase
                ((QPodArrayOps<char16_t> *)this,(this->d).ptr + (long)pcVar5,in_RDX);
      (this->d).ptr[(this->d).size] = L'\0';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::remove(qsizetype pos, qsizetype len)
{
    if (pos < 0)  // count from end of string
        pos += size();

    if (size_t(pos) >= size_t(size()) || len <= 0)
        return *this;

    len = std::min(len, size() - pos);

    if (!d->isShared()) {
        d->erase(d.begin() + pos, len);
        d.data()[d.size] = u'\0';
    } else {
        // TODO: either reserve "size()", which is bigger than needed, or
        // modify the shrinking-erase docs of this method (since the size
        // of "copy" won't have any extra capacity any more)
        const qsizetype sz = size() - len;
        QString copy{sz, Qt::Uninitialized};
        auto begin = d.begin();
        auto toRemove_start = d.begin() + pos;
        copy.d->copyRanges({{begin, toRemove_start},
                           {toRemove_start + len, d.end()}});
        swap(copy);
    }
    return *this;
}